

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

int __thiscall CVmBifTADS::rand(CVmBifTADS *this)

{
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  void *pvVar3;
  vm_obj_id_t vVar4;
  vm_datatype_t extraout_EAX;
  vm_datatype_t extraout_EAX_00;
  vm_datatype_t vVar5;
  uint32_t uVar6;
  int extraout_EAX_01;
  int iVar7;
  char *pcVar8;
  ushort *puVar9;
  RandStrParser *this_00;
  ulong val;
  uint uVar10;
  undefined8 unaff_RBP;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  anon_union_8_8_cb74652f_for_val *in_FS_OFFSET;
  bool bVar14;
  vm_val_t ret;
  err_frame_t err_cur__;
  vm_val_t local_118;
  vm_val_t local_108;
  void *local_f8;
  __jmp_buf_tag local_f0;
  
  uVar12 = (uint)this;
  vVar4 = (vm_obj_id_t)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if (uVar12 == 0) {
    bVar13 = 1;
    bVar14 = true;
  }
  else {
    if (uVar12 == 1) {
      if (sp_[-1].typ == VM_INT) {
        bVar13 = 1;
        bVar14 = true;
        vVar4 = sp_[-1].val.obj;
        sp_ = sp_ + -1;
        goto LAB_0025ec41;
      }
      iVar7 = vm_val_t::is_listlike(sp_ + -1);
      if (iVar7 != 0) {
        vVar4 = vm_val_t::ll_length(sp_ + -1);
        bVar14 = -1 < (int)vVar4;
        if (bVar14) {
          bVar13 = (byte)(vVar4 >> 0x1f);
          goto LAB_0025ec41;
        }
      }
      pcVar8 = vm_val_t::get_as_string(sp_ + -1);
      if (pcVar8 != (char *)0x0) {
        puVar9 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
        uVar1 = *puVar9;
        this_00 = (RandStrParser *)operator_new(0x18);
        RandStrParser::RandStrParser(this_00,(char *)(puVar9 + 1),(ulong)uVar1);
        G_err_frame::__tls_init();
        local_108.val.ptr = *(void **)in_FS_OFFSET;
        G_err_frame::__tls_init();
        in_FS_OFFSET->ptr = &local_108;
        local_108.typ = _setjmp(&local_f0);
        if (local_108.typ == 0) {
          RandStrParser::exec(this_00,&local_118);
          CVmBif::retval(&local_118);
        }
        if (-1 < (short)local_108.typ) {
          local_108.typ = local_108.typ | 0x8000;
          if (this_00->tree != (RandStrNode *)0x0) {
            (*this_00->tree->_vptr_RandStrNode[1])();
          }
          operator_delete(this_00,0x18);
        }
        aVar2 = local_108.val;
        G_err_frame::__tls_init();
        *in_FS_OFFSET = aVar2;
        vVar5 = local_108.typ & 0xffff;
        if ((local_108.typ & 0x4001) != 0) {
          G_err_frame::__tls_init();
          if ((*in_FS_OFFSET->ptr & 2) != 0) {
            G_err_frame::__tls_init();
            free(*(void **)((long)in_FS_OFFSET->ptr + 0x10));
          }
          pvVar3 = local_f8;
          G_err_frame::__tls_init();
          *(void **)((long)in_FS_OFFSET->ptr + 0x10) = pvVar3;
          err_rethrow();
          vVar5 = extraout_EAX;
        }
        if ((local_108.typ & VM_TRUE) != 0) {
          free(local_f8);
          vVar5 = extraout_EAX_00;
        }
        sp_ = sp_ + -1;
        return vVar5;
      }
    }
    bVar14 = false;
    bVar13 = 1;
    vVar4 = uVar12;
  }
LAB_0025ec41:
  uVar6 = rng_next();
  val = (ulong)uVar6;
  if (uVar12 != 0) {
    uVar10 = (uVar6 >> 0x10) * (vVar4 & 0xffff);
    uVar11 = (vVar4 >> 0x10) * (uVar6 & 0xffff);
    val = (ulong)(((uVar6 & 0xffff) * (vVar4 & 0xffff) >> 0x10) + (uVar10 & 0xffff) +
                  (uVar11 & 0xffff) >> 0x10) +
          (ulong)(uVar11 >> 0x10) +
          (ulong)(uVar10 >> 0x10) + (ulong)(vVar4 >> 0x10) * (ulong)(uVar6 >> 0x10);
  }
  if (bVar14) {
    if (bVar13 == 0) {
      if (vVar4 == 0) {
        local_118.typ = VM_NIL;
      }
      else {
        local_108.typ = VM_INT;
        local_108.val.obj = (int)val + 1;
        vm_val_t::ll_index(sp_ + -1,&local_118,&local_108);
      }
      CVmBif::retval(&local_118);
      iVar7 = 0x387118;
      sp_ = sp_ + -1;
    }
    else {
      CVmBif::retval_int(val);
      iVar7 = extraout_EAX_01;
    }
  }
  else {
    CVmBif::retval(sp_ + (-1 - (long)(int)val));
    iVar7 = uVar12 * 0x10;
    sp_ = sp_ + -(long)(int)uVar12;
  }
  return iVar7;
}

Assistant:

void CVmBifTADS::rand(VMG_ uint argc)
{
    int32_t range;
    int use_range;
    int choose_an_arg = FALSE;
    int choose_an_ele = FALSE;
    ulong rand_val;

    /* determine the desired range of values based on the arguments */
    if (argc == 0)
    {
        /* 
         *   if no argument is given, produce a random number in our full
         *   range - clear the 'use_range' flag to so indicate
         */
        use_range = FALSE;
    }
    else if (argc == 1 && G_stk->get(0)->typ == VM_INT)
    {
        /* we're returning a number in the range 0..(arg-1) */
        range = G_stk->get(0)->val.intval;
        use_range = TRUE;

        /* discard the argument */
        G_stk->discard();
    }
    else if (argc == 1
             && G_stk->get(0)->is_listlike(vmg0_)
             && (range = G_stk->get(0)->ll_length(vmg0_)) >= 0)
    {
        /* use the range of 1..length */
        use_range = TRUE;

        /* note that we're choosing from a list-like object */
        choose_an_ele = TRUE;

        /* note - leave the object on the stack as gc protection */
    }
    else if (argc == 1
             && G_stk->get(0)->get_as_string(vmg0_) != 0)
    {
        /* 
         *   It's a string, giving a template for generating a new random
         *   string.  First, get the string argument.  
         */
        const char *tpl = G_stk->get(0)->get_as_string(vmg0_);
        size_t tplbytes = vmb_get_len(tpl);
        tpl += VMB_LEN;

#if 1
        /* parse it */
        RandStrParser *rsp = new RandStrParser(tpl, tplbytes);

        err_try
        {
            /* generate the string */
            vm_val_t ret;
            rsp->exec(vmg_ &ret);

            /* return it */
            retval(vmg_ &ret);
        }
        err_finally
        {
            /* delete our parser on the way out */
            delete rsp;
        }
        err_end;
        
#else
        /* figure its character length */
        utf8_ptr tplp((char *)tpl);
        size_t tplchars = tplp.len(tplbytes);

        /* allocate temporary space for the result, as wide characters */
        wchar_t *buf = new wchar_t[tplchars], *dst;

        /* run through the template and generate random characters */
        for (dst = buf ; tplbytes != 0 ; )
        {
            /* generate a random number for this character */
            rand_val = rng_next(vmg0_);

            /* get and skip the next template character */
            wchar_t tch = tplp.getch();
            tplp.inc(&tplbytes);

            /* translate the template character */
            wchar_t ch;
            switch (tch)
            {
            case '.':
                /* printable ASCII character 32-126 */
                ch = (wchar_t)rand_range(rand_val, 32, 126);
                break;

            case '?':
                /* printable Latin-1 character 32-126, 160-255 */
                ch = (wchar_t)rand_range(rand_val, 32, 126, 160, 255);
                break;

            case '*':
                /* 
                 *   Printable Unicode character.  This excludes undefined
                 *   character, the private use area, and the control
                 *   characters.  
                 */
                for (;;)
                {
                    /* exclude the control and private use ranges */
                    ch = (wchar_t)rand_range(
                        rand_val, 32, 127, 160, 0xDFFF, 0xF900, 0xFFFE);

                    /* if it's a unicode character, we're set */
                    if (t3_is_unichar(ch))
                        break;

                    /* pick a new random number */
                    rand_val = rng_next(vmg0_);
                }
                break;

            case '9':
                /* digit 0-9 */
                ch = (wchar_t)rand_range(rand_val, '0', '9');
                break;

            case 'X':
                /* upper-case hex digit 0-9 A-F */
                ch = (wchar_t)rand_range(rand_val, '0', '9', 'A', 'F');
                break;

            case 'x':
                /* lower-case hex digit 0-9 a-f */
                ch = (wchar_t)rand_range(rand_val, '0', '9', 'a', 'f');
                break;

            case 'A':
                /* letter A-Z */
                ch = (wchar_t)rand_range(rand_val, 'A', 'Z');
                break;

            case 'a':
                /* letter a-z */
                ch = (wchar_t)rand_range(rand_val, 'a', 'z');
                break;

            case 'b':
                /* random byte value 0-255 */
                ch = (wchar_t)rand_range(rand_val, 0, 255);
                break;

            case 'c':
                /* mixed-case letter A-Z a-z */
                ch = (wchar_t)rand_range(rand_val, 'a', 'z', 'A', 'Z');
                break;

            case 'z':
                /* mixed-case letter or number 0-9 a-z A-Z */
                ch = (wchar_t)rand_range(rand_val,
                                         '0', '9', 'a', 'z', 'A', 'Z');
                break;

            case '[':
                /* 
                 *   Character range.  Scan the range to count the number of
                 *   characters included.  
                 */
                {
                    /* 
                     *   allocate a list of range descriptors - use 'len2' as
                     *   the range count, since at the most we could have one
                     *   range per byte (but it'll usually be less) 
                     */
                    struct rdesc
                    {
                        int set(wchar_t c)
                        {
                            start = end = c;
                            return 1;
                        }
                        int set(wchar_t a, wchar_t b)
                        {
                            if (b > a)
                                start = a, end = b;
                            else
                                start = b, end = a;
                            return end - start + 1;
                        }
                        wchar_t start;
                        wchar_t end;
                    };
                    rdesc *ranges = new rdesc[tplbytes];
                    int nranges = 0, nchars = 0;

                    /* scan for the closing ']' */
                    for ( ; tplbytes != 0 && tplp.getch() != ']' ;
                          tplp.inc(&tplbytes))
                    {
                        /* check for escapes */
                        wchar_t rch = tplp.getch();
                        if (rch == '%')
                        {
                            tplp.inc(&tplbytes);
                            rch = tplp.getch();
                        }
                        
                        /* if the next character is '-', it's a range */
                        if (tplbytes > 1 && tplp.getch_at(1) == '-')
                        {
                            /* skip the current character and the '-' */
                            tplp.inc(&tplbytes);
                            tplp.inc(&tplbytes);

                            /* if the next character is quoted, skip the % */
                            if (tplbytes > 1 && tplp.getch() == '%')
                                tplp.inc(&tplbytes);

                            /* 
                             *   The range count includes everything from
                             *   'rch' to the current character.  
                             */
                            if (tplbytes != 0)
                                nchars += ranges[nranges++].set(
                                    rch, tplp.getch());
                        }
                        else
                        {
                            /* it's a single character range */
                            nchars += ranges[nranges++].set(rch);
                        }
                        
                        /* if we're out of characters, we're done */
                        if (tplbytes == 0)
                            break;
                    }

                    /* pick a number from 0 to rcnt */
                    ch = (wchar_t)rand_range(rand_val, nchars);

                    /* find the character */
                    for (int i = 0 ; i < nranges ; ++i)
                    {
                        /* if it's in the current range, apply it */
                        const rdesc *r = &ranges[i];
                        if (ch <= r->end - r->start)
                        {
                            ch += r->start;
                            break;
                        }

                        /* 
                         *   it's not in this range, so deduct the range
                         *   length from the remainder and keep going 
                         */
                        ch -= r->end - r->start + 1;
                    }

                    /* done with the range list */
                    delete [] ranges;

                    /* skip the closing ']' */
                    if (tplbytes != 0 && tplp.getch() == ']')
                        tplp.inc(&tplbytes);
                }
                break;

            case '%':
                /* copy the next character unchanged */
                if (tplbytes != 0)
                {
                    ch = tplp.getch();
                    tplp.inc(&tplbytes);
                }
                else
                    ch = '%';
                break;

            default:
                /* no character */
                continue;
            }

            /* save it in our temp buffer, and note its utf8 size */
            *dst++ = ch;
        }

        /* convert the temp buffer to a real string */
        retval_obj(vmg_ CVmObjString::create(vmg_ FALSE, buf, dst - buf));

        /* done with the temporary buffer */
        delete [] buf;
#endif
        
        /* discard the argument */
        G_stk->discard();

        /* we're done */
        return;
    }
    else
    {
        /* 
         *   produce a random number in the range 0..(argc-1) so that we
         *   can select one of our arguments 
         */
        range = argc;
        use_range = TRUE;

        /* note that we should choose an argument value */
        choose_an_arg = TRUE;
    }

    /* get the next random number */
    rand_val = rng_next(vmg0_);

    /*
     *   Calculate our random value in the range 0..(range-1).  If range
     *   == 0, simply choose a value across our full range.  
     */
    if (use_range)
        rand_val = rand_range(rand_val, range);

    /*
     *   Return the appropriate value, depending on our argument list 
     */
    if (choose_an_arg)
    {
        /* return the selected argument */
        retval(vmg_ G_stk->get((int)rand_val));

        /* discard all of the arguments */
        G_stk->discard(argc);
    }
    else if (choose_an_ele)
    {
        vm_val_t val;

        /* get the selected element */
        if (range == 0)
        {
            /* there are no elements to choose from, so return nil */
            val.set_nil();
        }
        else
        {
            /* get the selected list element */
            G_stk->get(0)->ll_index(vmg_ &val, rand_val + 1);
        }

        /* set the result */
        retval(vmg_ &val);

        /* discard our gc protection */
        G_stk->discard();
    }
    else
    {
        /* simply return the random number */
        retval_int(vmg_ (long)rand_val);
    }
}